

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O1

void anon_unknown.dwarf_3e821::getFunctionsToKeepAndSplit
               (Module *wasm,uint64_t wasmHash,string *profileFile,
               set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *keepFuncs,
               set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *splitFuncs)

{
  pointer puVar1;
  Function *__v;
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  *this;
  pointer puVar2;
  ulong uVar3;
  undefined1 local_1d8 [392];
  undefined1 local_50 [8];
  ProfileData profile;
  
  readProfile((ProfileData *)local_50,profileFile);
  if (local_50 == (undefined1  [8])wasmHash) {
    puVar1 = (wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = 0;
    for (puVar2 = (wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      __v = (puVar2->_M_t).
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(__v->super_Importable).module + 8) == (char *)0x0) {
        if ((ulong)((long)((long)profile.timestamps.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start - profile.hash) >> 3) <=
            uVar3) {
          ::wasm::Fatal::Fatal((Fatal *)local_1d8);
          ::wasm::Fatal::operator<<
                    ((Fatal *)local_1d8,(char (*) [31])"Unexpected end of profile data");
          goto LAB_00110349;
        }
        this = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)keepFuncs;
        if (*(long *)(profile.hash + uVar3 * 8) == 0) {
          this = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)splitFuncs;
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>(this,(Name *)__v);
        uVar3 = uVar3 + 1;
      }
    }
    if (uVar3 == (long)((long)profile.timestamps.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - profile.hash) >> 3) {
      if (profile.hash != 0) {
        operator_delete((void *)profile.hash,
                        (long)profile.timestamps.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - profile.hash);
      }
      return;
    }
    ::wasm::Fatal::Fatal((Fatal *)local_1d8);
    ::wasm::Fatal::operator<<((Fatal *)local_1d8,(char (*) [30])"Unexpected extra profile data");
  }
  else {
    ::wasm::Fatal::Fatal((Fatal *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),
               "error: checksum in profile does not match module checksum. ",0x3b);
    ::wasm::Fatal::operator<<
              ((Fatal *)local_1d8,
               (char (*) [110])
               "The module to split must be the original, uninstrumented module, not the module used to generate the profile."
              );
  }
LAB_00110349:
  ::wasm::Fatal::~Fatal((Fatal *)local_1d8);
}

Assistant:

void getFunctionsToKeepAndSplit(Module& wasm,
                                uint64_t wasmHash,
                                const std::string& profileFile,
                                std::set<Name>& keepFuncs,
                                std::set<Name>& splitFuncs) {
  ProfileData profile = readProfile(profileFile);
  if (profile.hash != wasmHash) {
    Fatal() << "error: checksum in profile does not match module checksum. "
            << "The module to split must be the original, uninstrumented "
               "module, not the module used to generate the profile.";
  }

  size_t i = 0;
  ModuleUtils::iterDefinedFunctions(wasm, [&](Function* func) {
    if (i >= profile.timestamps.size()) {
      Fatal() << "Unexpected end of profile data";
    }
    if (profile.timestamps[i++] > 0) {
      keepFuncs.insert(func->name);
    } else {
      splitFuncs.insert(func->name);
    }
  });
  if (i != profile.timestamps.size()) {
    Fatal() << "Unexpected extra profile data";
  }
}